

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# casts.h
# Opt level: O1

void __thiscall
CoreML::Specification::CropResizeLayerParams::CheckTypeAndMergeFrom
          (CropResizeLayerParams *this,MessageLite *from)

{
  float fVar1;
  ulong uVar2;
  LogMessage *other;
  SamplingMode *pSVar3;
  BoxCoordinatesMode *pBVar4;
  undefined1 *puVar5;
  Arena *pAVar6;
  LogFinisher LStack_51;
  LogMessage LStack_50;
  
  if (from->_vptr_MessageLite != (_func_int **)&PTR__CropResizeLayerParams_004b6080) {
    __assert_fail("f == nullptr || dynamic_cast<To>(f) != nullptr",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/stubs/casts.h"
                  ,0x5e,
                  "To google::protobuf::internal::down_cast(From *) [To = const CoreML::Specification::CropResizeLayerParams *, From = const google::protobuf::MessageLite]"
                 );
  }
  if ((CropResizeLayerParams *)from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&LStack_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/build_O1/mlmodel/format/NeuralNetwork.pb.cc"
               ,0x7792);
    other = google::protobuf::internal::LogMessage::operator<<
                      (&LStack_50,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&LStack_51,other);
    google::protobuf::internal::LogMessage::~LogMessage(&LStack_50);
  }
  google::protobuf::RepeatedField<unsigned_long>::MergeFrom
            (&this->targetsize_,(RepeatedField<unsigned_long> *)(from + 1));
  if ((from != (MessageLite *)_CropResizeLayerParams_default_instance_) &&
     (from[2]._internal_metadata_.ptr_ != 0)) {
    if (this->mode_ == (SamplingMode *)0x0) {
      uVar2 = (this->super_MessageLite)._internal_metadata_.ptr_;
      pAVar6 = (Arena *)(uVar2 & 0xfffffffffffffffc);
      if ((uVar2 & 1) != 0) {
        pAVar6 = *(Arena **)pAVar6;
      }
      pSVar3 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::SamplingMode>
                         (pAVar6);
      this->mode_ = pSVar3;
    }
    puVar5 = (undefined1 *)from[2]._internal_metadata_.ptr_;
    if ((SamplingMode *)puVar5 == (SamplingMode *)0x0) {
      puVar5 = _SamplingMode_default_instance_;
    }
    SamplingMode::MergeFrom(this->mode_,(SamplingMode *)puVar5);
  }
  if ((from != (MessageLite *)_CropResizeLayerParams_default_instance_) &&
     (from[3]._vptr_MessageLite != (_func_int **)0x0)) {
    if (this->boxindicesmode_ == (BoxCoordinatesMode *)0x0) {
      uVar2 = (this->super_MessageLite)._internal_metadata_.ptr_;
      pAVar6 = (Arena *)(uVar2 & 0xfffffffffffffffc);
      if ((uVar2 & 1) != 0) {
        pAVar6 = *(Arena **)pAVar6;
      }
      pBVar4 = google::protobuf::Arena::
               CreateMaybeMessage<CoreML::Specification::BoxCoordinatesMode>(pAVar6);
      this->boxindicesmode_ = pBVar4;
    }
    puVar5 = (undefined1 *)from[3]._vptr_MessageLite;
    if ((BoxCoordinatesMode *)puVar5 == (BoxCoordinatesMode *)0x0) {
      puVar5 = _BoxCoordinatesMode_default_instance_;
    }
    BoxCoordinatesMode::MergeFrom(this->boxindicesmode_,(BoxCoordinatesMode *)puVar5);
  }
  if ((char)from[3]._internal_metadata_.ptr_ == '\x01') {
    this->normalizedcoordinates_ = true;
  }
  fVar1 = *(float *)((long)&from[3]._internal_metadata_.ptr_ + 4);
  if (fVar1 != 0.0) {
    this->spatialscale_ = fVar1;
  }
  uVar2 = (from->_internal_metadata_).ptr_;
  if ((uVar2 & 1) != 0) {
    google::protobuf::internal::InternalMetadata::DoMergeFrom<std::__cxx11::string>
              (&(this->super_MessageLite)._internal_metadata_,
               (string *)((uVar2 & 0xfffffffffffffffc) + 8));
  }
  return;
}

Assistant:

inline To down_cast(From* f) {                   // so we only accept pointers
  // Ensures that To is a sub-type of From *.  This test is here only
  // for compile-time type checking, and has no overhead in an
  // optimized build at run-time, as it will be optimized away
  // completely.
  if (false) {
    implicit_cast<From*, To>(0);
  }

#if !defined(NDEBUG) && PROTOBUF_RTTI
  assert(f == nullptr || dynamic_cast<To>(f) != nullptr);  // RTTI: debug mode only!
#endif
  return static_cast<To>(f);
}